

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrshift~.c
# Opt level: O0

t_int * rightshift_perform(t_int *w)

{
  int local_28;
  int local_24;
  int shift;
  int n;
  t_sample *out;
  t_sample *in;
  t_int *w_local;
  
  local_28 = (int)w[4];
  local_24 = (int)w[3] - local_28;
  _shift = w[2];
  out = (t_sample *)(w[1] + (long)local_28 * -4);
  while (local_24 != 0) {
    *(t_sample *)(_shift + -4) = out[-1];
    local_24 = local_24 + -1;
    _shift = _shift + -4;
    out = out + -1;
  }
  while (local_28 != 0) {
    *(undefined4 *)(_shift + -4) = 0;
    local_28 = local_28 + -1;
    _shift = _shift + -4;
  }
  return w + 5;
}

Assistant:

static t_int *rightshift_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out= (t_sample *)(w[2]);
    int n = (int)(w[3]);
    int shift = (int)(w[4]);
    n -= shift;
    in -= shift;
    while (n--)
        *--out = *--in;
    while (shift--)
        *--out = 0;
    return (w+5);
}